

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::caseAllowed
          (SparseTexture2LookupTestCase *this,GLint target,GLint format)

{
  bool bVar1;
  
  bVar1 = false;
  if (((format != 0x8c3d) && (bVar1 = false, format != 0x8d62)) && (format != 0x906f)) {
    bVar1 = format != 0x81a5 || target != 0x806f && (target & 0xfffffffdU) != 0x9100;
  }
  return bVar1;
}

Assistant:

bool SparseTexture2LookupTestCase::caseAllowed(GLint target, GLint format)
{
	DE_UNREF(target);

	// As shaders do not support some texture formats it is necessary to exclude them.
	if (format == GL_RGB565 || format == GL_RGB10_A2UI || format == GL_RGB9_E5)
	{
		return false;
	}

	if ((target == GL_TEXTURE_2D_MULTISAMPLE || target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY || target == GL_TEXTURE_3D) &&
		(format == GL_DEPTH_COMPONENT16))
	{
		return false;
	}

	return true;
}